

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# newtonmin.c
# Opt level: O0

void fdjac(custom_gradient *funcgrad,double *x,int N,double *jac,double *dx,double eps2,double *J)

{
  double dVar1;
  double *__ptr;
  double dVar2;
  double *fj;
  double stepmax;
  double temp;
  double stepsize;
  int j;
  int i;
  double *J_local;
  double eps2_local;
  double *dx_local;
  double *jac_local;
  int N_local;
  double *x_local;
  custom_gradient *funcgrad_local;
  
  __ptr = (double *)malloc((long)N << 3);
  for (stepsize._0_4_ = 0; stepsize._0_4_ < N; stepsize._0_4_ = stepsize._0_4_ + 1) {
    if (ABS(x[stepsize._0_4_]) < 1.0 / ABS(dx[stepsize._0_4_])) {
      dVar2 = signx(x[stepsize._0_4_]);
      fj = (double *)((dVar2 * 1.0) / ABS(dx[stepsize._0_4_]));
    }
    else {
      fj = (double *)x[stepsize._0_4_];
    }
    dVar2 = x[stepsize._0_4_];
    x[stepsize._0_4_] = eps2 * (double)fj + x[stepsize._0_4_];
    dVar1 = x[stepsize._0_4_];
    (*funcgrad->funcgrad)(x,N,__ptr,funcgrad->params);
    for (stepsize._4_4_ = 0; stepsize._4_4_ < N; stepsize._4_4_ = stepsize._4_4_ + 1) {
      J[stepsize._4_4_ * N + stepsize._0_4_] =
           (__ptr[stepsize._4_4_] - jac[stepsize._4_4_]) / (dVar1 - dVar2);
    }
    x[stepsize._0_4_] = dVar2;
  }
  free(__ptr);
  return;
}

Assistant:

void fdjac(custom_gradient *funcgrad, double *x, int N, double *jac, double *dx, double eps2, double *J) {
	int i,j;
	double stepsize,temp,stepmax;
	double *fj;

	fj = (double*) malloc(sizeof(double) *N);

	for(j = 0; j < N;++j) {

		if (fabs(x[j]) >= (1.0 / fabs(dx[j]))) {
			stepmax = x[j];
		} else {
			stepmax = signx(x[j]) * 1.0 / fabs(dx[j]);
		}

		stepsize = eps2 * stepmax;
		temp = x[j];
		x[j] += stepsize;
		stepsize = x[j] - temp;
		FUNCGRAD_EVAL(funcgrad, x, N, fj);

		for(i = 0;i < N;++i) {
			J[i*N+j] = (fj[i] - jac[i]) / stepsize;
		}
		x[j] = temp;

	}

	free(fj);
}